

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O2

bool FIX::TimeRange::isInRange
               (DateTime *startTime,DateTime *endTime,int startDay,int endDay,DateTime *time,int day
               )

{
  bool bVar1;
  DateTime local_18;
  
  local_18.m_time = time->m_time;
  local_18._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  local_18._8_8_ = *(ulong *)&time->m_date & 0xffffffff00000000;
  if (startDay == endDay) {
    if (day == startDay) {
      bVar1 = isInRange(startTime,endTime,time);
      return bVar1;
    }
    return true;
  }
  if (startDay < endDay) {
    if (endDay < day || day < startDay) {
      return false;
    }
  }
  else {
    if (startDay <= endDay) {
      return true;
    }
    if (day < startDay && endDay < day) {
      return false;
    }
  }
  if (((day != startDay) ||
      ((startTime->m_date < 1 && ((startTime->m_date < 0 || (startTime->m_time <= local_18.m_time)))
       ))) && ((day != endDay || (bVar1 = operator>(&local_18,endTime), !bVar1)))) {
    return true;
  }
  return false;
}

Assistant:

bool TimeRange::isInRange(
    const DateTime &startTime,
    const DateTime &endTime,
    int startDay,
    int endDay,
    const DateTime &time,
    int day) {
  UtcTimeOnly timeOnly(time);

  if (startDay == endDay) {
    if (day != startDay) {
      return true;
    }
    return isInRange(startTime, endTime, time);
  } else if (startDay < endDay) {
    if (day < startDay || day > endDay) {
      return false;
    } else if (day == startDay && timeOnly < startTime) {
      return false;
    } else if (day == endDay && timeOnly > endTime) {
      return false;
    }
  } else if (startDay > endDay) {
    if (day < startDay && day > endDay) {
      return false;
    } else if (day == startDay && timeOnly < startTime) {
      return false;
    } else if (day == endDay && timeOnly > endTime) {
      return false;
    }
  }
  return true;
}